

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationBuilder::addReset
          (CollationBuilder *this,int32_t strength,UnicodeString *str,char **parserErrorReason,
          UErrorCode *errorCode)

{
  bool bVar1;
  UBool UVar2;
  char16_t cVar3;
  int32_t iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t weight16_1;
  int32_t previousStrength;
  int32_t i;
  int32_t previousIndex;
  uint32_t previousWeight16;
  uint32_t weight16;
  int32_t nextIndex;
  uint32_t p;
  int64_t node;
  int32_t index;
  undefined1 local_70 [8];
  UnicodeString nfdString;
  UErrorCode *errorCode_local;
  char **parserErrorReason_local;
  UnicodeString *str_local;
  int32_t strength_local;
  CollationBuilder *this_local;
  
  nfdString.fUnion._48_8_ = errorCode;
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    cVar3 = UnicodeString::charAt(str,0);
    if (cVar3 == L'\xfffe') {
      iVar7 = getSpecialResetPosition
                        (this,str,parserErrorReason,(UErrorCode *)nfdString.fUnion._48_8_);
      this->ces[0] = iVar7;
      this->cesLength = 1;
      UVar2 = ::U_FAILURE(*(UErrorCode *)nfdString.fUnion._48_8_);
      if (UVar2 != '\0') {
        return;
      }
    }
    else {
      Normalizer2::normalize
                ((UnicodeString *)local_70,this->nfd,str,(UErrorCode *)nfdString.fUnion._48_8_);
      UVar2 = ::U_FAILURE(*(UErrorCode *)nfdString.fUnion._48_8_);
      if (UVar2 == '\0') {
        iVar4 = CollationDataBuilder::getCEs
                          (this->dataBuilder,(UnicodeString *)local_70,this->ces,0);
        this->cesLength = iVar4;
        if (this->cesLength < 0x20) {
          bVar1 = false;
        }
        else {
          *(undefined4 *)nfdString.fUnion._48_8_ = 1;
          *parserErrorReason = "reset position maps to too many collation elements (more than 31)";
          bVar1 = true;
        }
      }
      else {
        *parserErrorReason = "normalizing the reset position";
        bVar1 = true;
      }
      UnicodeString::~UnicodeString((UnicodeString *)local_70);
      if (bVar1) {
        return;
      }
    }
    if (strength != 0xf) {
      node._4_4_ = findOrInsertNodeForCEs
                             (this,strength,parserErrorReason,(UErrorCode *)nfdString.fUnion._48_8_)
      ;
      UVar2 = ::U_FAILURE(*(UErrorCode *)nfdString.fUnion._48_8_);
      if (UVar2 == '\0') {
        _nextIndex = UVector64::elementAti(&this->nodes,node._4_4_);
        while (iVar4 = strengthFromNode(_nextIndex), strength < iVar4) {
          node._4_4_ = previousIndexFromNode(_nextIndex);
          _nextIndex = UVector64::elementAti(&this->nodes,node._4_4_);
        }
        iVar4 = strengthFromNode(_nextIndex);
        str_local._4_4_ = strength;
        if ((iVar4 == strength) && (UVar2 = isTailoredNode(_nextIndex), UVar2 != '\0')) {
          node._4_4_ = previousIndexFromNode(_nextIndex);
        }
        else if (strength == 0) {
          uVar5 = weight32FromNode(_nextIndex);
          if (uVar5 == 0) {
            *(undefined4 *)nfdString.fUnion._48_8_ = 0x10;
            *parserErrorReason = "reset primary-before ignorable not possible";
            return;
          }
          uVar6 = CollationRootElements::getFirstPrimary(&this->rootElements);
          if (uVar5 <= uVar6) {
            *(undefined4 *)nfdString.fUnion._48_8_ = 0x10;
            *parserErrorReason = "reset primary-before first non-ignorable not supported";
            return;
          }
          if (uVar5 == 0xff020200) {
            *(undefined4 *)nfdString.fUnion._48_8_ = 0x10;
            *parserErrorReason = "reset primary-before [first trailing] not supported";
            return;
          }
          UVar2 = CollationData::isCompressiblePrimary(this->baseData,uVar5);
          uVar5 = CollationRootElements::getPrimaryBefore(&this->rootElements,uVar5,UVar2);
          uVar5 = findOrInsertNodeForPrimary(this,uVar5,(UErrorCode *)nfdString.fUnion._48_8_);
          do {
            node._4_4_ = uVar5;
            iVar7 = UVector64::elementAti(&this->nodes,node._4_4_);
            uVar5 = nextIndexFromNode(iVar7);
          } while (uVar5 != 0);
        }
        else {
          node._4_4_ = findCommonNode(this,node._4_4_,1);
          if (1 < strength) {
            node._4_4_ = findCommonNode(this,node._4_4_,2);
          }
          iVar7 = UVector64::elementAti(&this->nodes,node._4_4_);
          iVar4 = strengthFromNode(iVar7);
          if (iVar4 == strength) {
            uVar5 = weight16FromNode(iVar7);
            if (uVar5 == 0) {
              *(undefined4 *)nfdString.fUnion._48_8_ = 0x10;
              if (strength == 1) {
                *parserErrorReason = "reset secondary-before secondary ignorable not possible";
                return;
              }
              *parserErrorReason = "reset tertiary-before completely ignorable not possible";
              return;
            }
            uVar6 = getWeight16Before(this,node._4_4_,iVar7,strength);
            uVar5 = previousIndexFromNode(iVar7);
            weight16_1 = uVar5;
            while( true ) {
              iVar7 = UVector64::elementAti(&this->nodes,weight16_1);
              iVar4 = strengthFromNode(iVar7);
              if (iVar4 < strength) break;
              if ((iVar4 == strength) && (UVar2 = isTailoredNode(iVar7), UVar2 == '\0')) {
                i = weight16FromNode(iVar7);
                goto LAB_0029c729;
              }
              weight16_1 = previousIndexFromNode(iVar7);
            }
            i = 0x500;
LAB_0029c729:
            if (i != uVar6) {
              uVar8 = nodeFromWeight16(uVar6);
              uVar9 = nodeFromStrength(strength);
              uVar5 = insertNodeBetween(this,uVar5,node._4_4_,uVar8 | uVar9,
                                        (UErrorCode *)nfdString.fUnion._48_8_);
            }
          }
          else {
            uVar5 = getWeight16Before(this,node._4_4_,iVar7,strength);
            uVar5 = findOrInsertWeakNode
                              (this,node._4_4_,uVar5,strength,(UErrorCode *)nfdString.fUnion._48_8_)
            ;
          }
          node._4_4_ = uVar5;
          str_local._4_4_ = ceStrength(this->ces[this->cesLength + -1]);
        }
        UVar2 = ::U_FAILURE(*(UErrorCode *)nfdString.fUnion._48_8_);
        if (UVar2 == '\0') {
          iVar7 = tempCEFromIndexAndStrength(node._4_4_,str_local._4_4_);
          this->ces[this->cesLength + -1] = iVar7;
        }
        else {
          *parserErrorReason = "inserting reset position for &[before n]";
        }
      }
    }
  }
  return;
}

Assistant:

void
CollationBuilder::addReset(int32_t strength, const UnicodeString &str,
                           const char *&parserErrorReason, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    U_ASSERT(!str.isEmpty());
    if(str.charAt(0) == CollationRuleParser::POS_LEAD) {
        ces[0] = getSpecialResetPosition(str, parserErrorReason, errorCode);
        cesLength = 1;
        if(U_FAILURE(errorCode)) { return; }
        U_ASSERT((ces[0] & Collation::CASE_AND_QUATERNARY_MASK) == 0);
    } else {
        // normal reset to a character or string
        UnicodeString nfdString = nfd.normalize(str, errorCode);
        if(U_FAILURE(errorCode)) {
            parserErrorReason = "normalizing the reset position";
            return;
        }
        cesLength = dataBuilder->getCEs(nfdString, ces, 0);
        if(cesLength > Collation::MAX_EXPANSION_LENGTH) {
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            parserErrorReason = "reset position maps to too many collation elements (more than 31)";
            return;
        }
    }
    if(strength == UCOL_IDENTICAL) { return; }  // simple reset-at-position

    // &[before strength]position
    U_ASSERT(UCOL_PRIMARY <= strength && strength <= UCOL_TERTIARY);
    int32_t index = findOrInsertNodeForCEs(strength, parserErrorReason, errorCode);
    if(U_FAILURE(errorCode)) { return; }

    int64_t node = nodes.elementAti(index);
    // If the index is for a "weaker" node,
    // then skip backwards over this and further "weaker" nodes.
    while(strengthFromNode(node) > strength) {
        index = previousIndexFromNode(node);
        node = nodes.elementAti(index);
    }

    // Find or insert a node whose index we will put into a temporary CE.
    if(strengthFromNode(node) == strength && isTailoredNode(node)) {
        // Reset to just before this same-strength tailored node.
        index = previousIndexFromNode(node);
    } else if(strength == UCOL_PRIMARY) {
        // root primary node (has no previous index)
        uint32_t p = weight32FromNode(node);
        if(p == 0) {
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "reset primary-before ignorable not possible";
            return;
        }
        if(p <= rootElements.getFirstPrimary()) {
            // There is no primary gap between ignorables and the space-first-primary.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "reset primary-before first non-ignorable not supported";
            return;
        }
        if(p == Collation::FIRST_TRAILING_PRIMARY) {
            // We do not support tailoring to an unassigned-implicit CE.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "reset primary-before [first trailing] not supported";
            return;
        }
        p = rootElements.getPrimaryBefore(p, baseData->isCompressiblePrimary(p));
        index = findOrInsertNodeForPrimary(p, errorCode);
        // Go to the last node in this list:
        // Tailor after the last node between adjacent root nodes.
        for(;;) {
            node = nodes.elementAti(index);
            int32_t nextIndex = nextIndexFromNode(node);
            if(nextIndex == 0) { break; }
            index = nextIndex;
        }
    } else {
        // &[before 2] or &[before 3]
        index = findCommonNode(index, UCOL_SECONDARY);
        if(strength >= UCOL_TERTIARY) {
            index = findCommonNode(index, UCOL_TERTIARY);
        }
        // findCommonNode() stayed on the stronger node or moved to
        // an explicit common-weight node of the reset-before strength.
        node = nodes.elementAti(index);
        if(strengthFromNode(node) == strength) {
            // Found a same-strength node with an explicit weight.
            uint32_t weight16 = weight16FromNode(node);
            if(weight16 == 0) {
                errorCode = U_UNSUPPORTED_ERROR;
                if(strength == UCOL_SECONDARY) {
                    parserErrorReason = "reset secondary-before secondary ignorable not possible";
                } else {
                    parserErrorReason = "reset tertiary-before completely ignorable not possible";
                }
                return;
            }
            U_ASSERT(weight16 > Collation::BEFORE_WEIGHT16);
            // Reset to just before this node.
            // Insert the preceding same-level explicit weight if it is not there already.
            // Which explicit weight immediately precedes this one?
            weight16 = getWeight16Before(index, node, strength);
            // Does this preceding weight have a node?
            uint32_t previousWeight16;
            int32_t previousIndex = previousIndexFromNode(node);
            for(int32_t i = previousIndex;; i = previousIndexFromNode(node)) {
                node = nodes.elementAti(i);
                int32_t previousStrength = strengthFromNode(node);
                if(previousStrength < strength) {
                    U_ASSERT(weight16 >= Collation::COMMON_WEIGHT16 || i == previousIndex);
                    // Either the reset element has an above-common weight and
                    // the parent node provides the implied common weight,
                    // or the reset element has a weight<=common in the node
                    // right after the parent, and we need to insert the preceding weight.
                    previousWeight16 = Collation::COMMON_WEIGHT16;
                    break;
                } else if(previousStrength == strength && !isTailoredNode(node)) {
                    previousWeight16 = weight16FromNode(node);
                    break;
                }
                // Skip weaker nodes and same-level tailored nodes.
            }
            if(previousWeight16 == weight16) {
                // The preceding weight has a node,
                // maybe with following weaker or tailored nodes.
                // Reset to the last of them.
                index = previousIndex;
            } else {
                // Insert a node with the preceding weight, reset to that.
                node = nodeFromWeight16(weight16) | nodeFromStrength(strength);
                index = insertNodeBetween(previousIndex, index, node, errorCode);
            }
        } else {
            // Found a stronger node with implied strength-common weight.
            uint32_t weight16 = getWeight16Before(index, node, strength);
            index = findOrInsertWeakNode(index, weight16, strength, errorCode);
        }
        // Strength of the temporary CE = strength of its reset position.
        // Code above raises an error if the before-strength is stronger.
        strength = ceStrength(ces[cesLength - 1]);
    }
    if(U_FAILURE(errorCode)) {
        parserErrorReason = "inserting reset position for &[before n]";
        return;
    }
    ces[cesLength - 1] = tempCEFromIndexAndStrength(index, strength);
}